

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

complex<double> * c8mat_uniform_01_new(int m,int n,int *seed)

{
  int iVar1;
  complex<double> *__s;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  iVar1 = n * m;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar5 = (long)iVar1 << 4;
  }
  __s = (complex<double> *)operator_new__(uVar5);
  if (iVar1 != 0) {
    memset(__s,0,(long)iVar1 << 4);
  }
  uVar5 = 0;
  uVar8 = 0;
  if (0 < m) {
    uVar8 = (ulong)(uint)m;
  }
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar5;
  }
  lVar7 = (long)__s->_M_value + 8;
  for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    for (lVar6 = 0; uVar8 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
      iVar3 = (*seed % 0x1f31d) * 0x41a7;
      iVar1 = (*seed / 0x1f31d) * -0xb14;
      iVar4 = iVar3 + iVar1;
      iVar1 = iVar3 + iVar1 + 0x7fffffff;
      if (-1 < iVar4) {
        iVar1 = iVar4;
      }
      *seed = iVar1;
      dVar9 = (double)iVar1 * 4.656612875e-10;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      iVar3 = (*seed % 0x1f31d) * 0x41a7;
      iVar1 = (*seed / 0x1f31d) * -0xb14;
      iVar4 = iVar3 + iVar1;
      iVar1 = iVar3 + iVar1 + 0x7fffffff;
      if (-1 < iVar4) {
        iVar1 = iVar4;
      }
      *seed = iVar1;
      dVar10 = (double)iVar1 * 4.656612875e-10 * 6.283185307179586;
      dVar11 = cos(dVar10);
      dVar10 = sin(dVar10);
      *(double *)(lVar7 + lVar6 + -8) = dVar11 * dVar9;
      *(double *)(lVar7 + lVar6) = dVar10 * dVar9;
    }
    lVar7 = lVar7 + (long)m * 0x10;
  }
  return __s;
}

Assistant:

complex <double> *c8mat_uniform_01_new ( int m, int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    C8MAT_UNIFORM_01_NEW returns a unit pseudorandom C8MAT.
//
//  Discussion:
//
//    A C8MAT is an array of complex <double> values.
//
//    The angles should be uniformly distributed between 0 and 2 * PI,
//    the square roots of the radius uniformly distributed between 0 and 1.
//
//    This results in a uniform distribution of values in the unit circle.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    15 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the matrix.
//
//    Input/output, int &SEED, the "seed" value, which should NOT be 0.
//    On output, SEED has been updated.
//
//    Output, complex <double> C8MAT_UNIFORM_01_NEW[M*N], the pseudorandom 
//    complex matrix.
//
{
  complex <double> *c;
  int i;
  int j;
  double r;
  int k;
  const double r8_pi = 3.141592653589793;
  double theta;

  c = new complex <double> [m*n];

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < m; i++ )
    {
      k = seed / 127773;

      seed = 16807 * ( seed - k * 127773 ) - k * 2836;

      if ( seed < 0 )
      {
        seed = seed + 2147483647;
      }

      r = sqrt ( static_cast<double>(seed) * 4.656612875E-10 );

      k = seed / 127773;

      seed = 16807 * ( seed - k * 127773 ) - k * 2836;

      if ( seed < 0 )
      {
        seed = seed + 2147483647;
      }

      theta = 2.0 * r8_pi * ( static_cast<double>(seed) * 4.656612875E-10 );

      c[i+j*m] = r * complex <double> ( cos ( theta ), sin ( theta ) );
    }
  }
  return c;
}